

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O2

epoll_event * __thiscall cppnet::AlloterWrap::PoolNew<epoll_event>(AlloterWrap *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  epoll_event *peVar3;
  
  peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Alloter[3])(peVar1,0xc);
  peVar3 = (epoll_event *)CONCAT44(extraout_var,iVar2);
  if (peVar3 != (epoll_event *)0x0) {
    *(undefined4 *)((long)&peVar3->data + 4) = 0;
    *(undefined8 *)peVar3 = 0;
  }
  return peVar3;
}

Assistant:

T* AlloterWrap::PoolNew(Args&&... args) {
    uint32_t sz = sizeof(T);
    
    void* data = _alloter->MallocAlign(sz);
    if (!data) {
        return nullptr;
    }

    T* res = new(data) T(std::forward<Args>(args)...);
    return res;
}